

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

CloseFrame *
uWS::WebSocketProtocol<false>::parseClosePayload
          (CloseFrame *__return_storage_ptr__,char *src,size_t length)

{
  bool bVar1;
  uint uVar2;
  uint16_t uVar3;
  uchar *s;
  WebSocketProtocol<false> *this;
  
  if (length < 2) {
    s = (uchar *)0x0;
    this = (WebSocketProtocol<false> *)0x0;
    uVar3 = 0;
LAB_00111177:
    __return_storage_ptr__->code = uVar3;
    *(undefined4 *)&__return_storage_ptr__->field_0x2 = 0;
    *(undefined2 *)&__return_storage_ptr__->field_0x6 = 0;
    __return_storage_ptr__->message = (char *)this;
    __return_storage_ptr__->length = (size_t)s;
  }
  else {
    uVar3 = *(ushort *)src << 8 | *(ushort *)src >> 8;
    uVar2 = uVar3 - 0x3f4 & 0xffff;
    if (2 < (ushort)(uVar3 - 0x3ec) && (0xbab < uVar2 && 0xf05f < (ushort)(uVar3 + 0xec78))) {
      s = (uchar *)(length - 2);
      this = (WebSocketProtocol<false> *)(src + 2);
      bVar1 = isValidUtf8(this,s,(ulong)uVar2);
      if (bVar1) goto LAB_00111177;
    }
    *(undefined8 *)__return_storage_ptr__ = 0;
    __return_storage_ptr__->message = (char *)0x0;
    __return_storage_ptr__->length = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

static inline CloseFrame parseClosePayload(char *src, size_t length) {
        CloseFrame cf = {};
        if (length >= 2) {
            memcpy(&cf.code, src, 2);
            cf = {ntohs(cf.code), src + 2, length - 2};
            if (cf.code < 1000 || cf.code > 4999 || (cf.code > 1011 && cf.code < 4000) ||
                (cf.code >= 1004 && cf.code <= 1006) || !isValidUtf8((unsigned char *) cf.message, cf.length)) {
                return {};
            }
        }
        return cf;
    }